

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::ssa_transform_fix(Generator *top)

{
  undefined1 local_58 [8];
  SSATransformFixVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  SSATransformFixVisitor::SSATransformFixVisitor((SSATransformFixVisitor *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  SSATransformFixVisitor::~SSATransformFixVisitor((SSATransformFixVisitor *)local_58);
  return;
}

Assistant:

void ssa_transform_fix(Generator *top) {
    SSATransformFixVisitor visitor;
    visitor.visit_root(top);
}